

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  ostream *poVar2;
  pointer pSVar3;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pSVar3 -
                  (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                        super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x50)) {
    lineInfo.file = (char *)((ulong)lineInfo.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar3 = pSVar3 + 1, pSVar3 != pSVar1) {
      printHeaderString(this,&pSVar3->name,2);
    }
    Colour::~Colour((Colour *)&lineInfo);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lineInfo.file = pSVar3[-1].lineInfo.file;
  lineInfo.line = pSVar3[-1].lineInfo.line;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000017ffb0 = 0x2d2d2d2d2d2d2d;
    uRam000000000017ffb7._0_1_ = '-';
    uRam000000000017ffb7._1_1_ = '-';
    uRam000000000017ffb7._2_1_ = '-';
    uRam000000000017ffb7._3_1_ = '-';
    uRam000000000017ffb7._4_1_ = '-';
    uRam000000000017ffb7._5_1_ = '-';
    uRam000000000017ffb7._6_1_ = '-';
    uRam000000000017ffb7._7_1_ = '-';
    DAT_0017ffa0 = '-';
    DAT_0017ffa0_1._0_1_ = '-';
    DAT_0017ffa0_1._1_1_ = '-';
    DAT_0017ffa0_1._2_1_ = '-';
    DAT_0017ffa0_1._3_1_ = '-';
    DAT_0017ffa0_1._4_1_ = '-';
    DAT_0017ffa0_1._5_1_ = '-';
    DAT_0017ffa0_1._6_1_ = '-';
    uRam000000000017ffa8 = 0x2d2d2d2d2d2d2d;
    DAT_0017ffaf = 0x2d;
    DAT_0017ff90 = '-';
    DAT_0017ff90_1._0_1_ = '-';
    DAT_0017ff90_1._1_1_ = '-';
    DAT_0017ff90_1._2_1_ = '-';
    DAT_0017ff90_1._3_1_ = '-';
    DAT_0017ff90_1._4_1_ = '-';
    DAT_0017ff90_1._5_1_ = '-';
    DAT_0017ff90_1._6_1_ = '-';
    uRam000000000017ff98._0_1_ = '-';
    uRam000000000017ff98._1_1_ = '-';
    uRam000000000017ff98._2_1_ = '-';
    uRam000000000017ff98._3_1_ = '-';
    uRam000000000017ff98._4_1_ = '-';
    uRam000000000017ff98._5_1_ = '-';
    uRam000000000017ff98._6_1_ = '-';
    uRam000000000017ff98._7_1_ = '-';
    DAT_0017ff80 = '-';
    DAT_0017ff80_1._0_1_ = '-';
    DAT_0017ff80_1._1_1_ = '-';
    DAT_0017ff80_1._2_1_ = '-';
    DAT_0017ff80_1._3_1_ = '-';
    DAT_0017ff80_1._4_1_ = '-';
    DAT_0017ff80_1._5_1_ = '-';
    DAT_0017ff80_1._6_1_ = '-';
    uRam000000000017ff88._0_1_ = '-';
    uRam000000000017ff88._1_1_ = '-';
    uRam000000000017ff88._2_1_ = '-';
    uRam000000000017ff88._3_1_ = '-';
    uRam000000000017ff88._4_1_ = '-';
    uRam000000000017ff88._5_1_ = '-';
    uRam000000000017ff88._6_1_ = '-';
    uRam000000000017ff88._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000017ff78._0_1_ = '-';
    uRam000000000017ff78._1_1_ = '-';
    uRam000000000017ff78._2_1_ = '-';
    uRam000000000017ff78._3_1_ = '-';
    uRam000000000017ff78._4_1_ = '-';
    uRam000000000017ff78._5_1_ = '-';
    uRam000000000017ff78._6_1_ = '-';
    uRam000000000017ff78._7_1_ = '-';
    DAT_0017ffbf = 0;
  }
  poVar2 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar2,'\n');
  colourGuard.m_moved = false;
  Colour::use(FileName);
  os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  Catch::operator<<(os,&lineInfo);
  std::operator<<((ostream *)os,'\n');
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000180050 = 0x2e2e2e2e2e2e2e;
    uRam0000000000180057._0_1_ = '.';
    uRam0000000000180057._1_1_ = '.';
    uRam0000000000180057._2_1_ = '.';
    uRam0000000000180057._3_1_ = '.';
    uRam0000000000180057._4_1_ = '.';
    uRam0000000000180057._5_1_ = '.';
    uRam0000000000180057._6_1_ = '.';
    uRam0000000000180057._7_1_ = '.';
    DAT_00180040 = '.';
    DAT_00180040_1._0_1_ = '.';
    DAT_00180040_1._1_1_ = '.';
    DAT_00180040_1._2_1_ = '.';
    DAT_00180040_1._3_1_ = '.';
    DAT_00180040_1._4_1_ = '.';
    DAT_00180040_1._5_1_ = '.';
    DAT_00180040_1._6_1_ = '.';
    uRam0000000000180048 = 0x2e2e2e2e2e2e2e;
    DAT_0018004f = 0x2e;
    DAT_00180030 = '.';
    DAT_00180030_1._0_1_ = '.';
    DAT_00180030_1._1_1_ = '.';
    DAT_00180030_1._2_1_ = '.';
    DAT_00180030_1._3_1_ = '.';
    DAT_00180030_1._4_1_ = '.';
    DAT_00180030_1._5_1_ = '.';
    DAT_00180030_1._6_1_ = '.';
    uRam0000000000180038._0_1_ = '.';
    uRam0000000000180038._1_1_ = '.';
    uRam0000000000180038._2_1_ = '.';
    uRam0000000000180038._3_1_ = '.';
    uRam0000000000180038._4_1_ = '.';
    uRam0000000000180038._5_1_ = '.';
    uRam0000000000180038._6_1_ = '.';
    uRam0000000000180038._7_1_ = '.';
    DAT_00180020 = '.';
    DAT_00180020_1._0_1_ = '.';
    DAT_00180020_1._1_1_ = '.';
    DAT_00180020_1._2_1_ = '.';
    DAT_00180020_1._3_1_ = '.';
    DAT_00180020_1._4_1_ = '.';
    DAT_00180020_1._5_1_ = '.';
    DAT_00180020_1._6_1_ = '.';
    uRam0000000000180028._0_1_ = '.';
    uRam0000000000180028._1_1_ = '.';
    uRam0000000000180028._2_1_ = '.';
    uRam0000000000180028._3_1_ = '.';
    uRam0000000000180028._4_1_ = '.';
    uRam0000000000180028._5_1_ = '.';
    uRam0000000000180028._6_1_ = '.';
    uRam0000000000180028._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000180018._0_1_ = '.';
    uRam0000000000180018._1_1_ = '.';
    uRam0000000000180018._2_1_ = '.';
    uRam0000000000180018._3_1_ = '.';
    uRam0000000000180018._4_1_ = '.';
    uRam0000000000180018._5_1_ = '.';
    uRam0000000000180018._6_1_ = '.';
    uRam0000000000180018._7_1_ = '.';
    DAT_0018005f = 0;
  }
  poVar2 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  poVar2 = std::operator<<(poVar2,'\n');
  std::endl<char,std::char_traits<char>>(poVar2);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}